

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

bool __thiscall dxil_spv::Converter::Impl::emit_execution_modes_amplification(Impl *this)

{
  bool bVar1;
  MetadataKind MVar2;
  Builder *this_00;
  MDNode *pMVar3;
  LoggingCallback p_Var4;
  void *pvVar5;
  Capability local_1018 [3];
  undefined3 uStack_100b;
  undefined5 uStack_1008;
  char acStack_1003 [4083];
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  spv::Builder::addExtension(this_00,"SPV_EXT_mesh_shader");
  local_1018[0] = 0x14a3;
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&this_00->capabilities,local_1018);
  pMVar3 = (MDNode *)get_shader_property_tag(this->entry_point_meta,ASState);
  if (pMVar3 == (MDNode *)0x0) {
    return false;
  }
  MVar2 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)pMVar3);
  if (MVar2 == Node) {
    pMVar3 = (MDNode *)LLVMBC::MDNode::getOperand(pMVar3,0);
    MVar2 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)pMVar3);
    if (MVar2 == Node) {
      bVar1 = emit_execution_modes_thread_wave_properties(this,pMVar3);
      return bVar1;
    }
    p_Var4 = get_thread_log_callback();
    if (p_Var4 == (LoggingCallback)0x0) {
      emit_execution_modes_amplification();
      std::terminate();
    }
  }
  else {
    p_Var4 = get_thread_log_callback();
    if (p_Var4 == (LoggingCallback)0x0) {
      emit_execution_modes_amplification();
      std::terminate();
    }
  }
  uStack_1008 = 0x6163206e69;
  builtin_strncpy(acStack_1003,"st<T>.\n",8);
  local_1018._0_8_ = 0x2064696c61766e49;
  stack0xffffffffffffeff0 = 0x2065707974;
  uStack_100b = 0x204449;
  pvVar5 = get_thread_log_callback_userdata();
  (*p_Var4)(pvVar5,Error,(char *)local_1018);
  std::terminate();
}

Assistant:

bool Converter::Impl::emit_execution_modes_amplification()
{
	auto &builder = spirv_module.get_builder();

	builder.addExtension("SPV_EXT_mesh_shader");
	builder.addCapability(spv::CapabilityMeshShadingEXT);

	auto *as_state_node = get_shader_property_tag(entry_point_meta, DXIL::ShaderPropertyTag::ASState);

	if (as_state_node)
	{
		auto *arguments = llvm::cast<llvm::MDNode>(*as_state_node);
		auto *num_threads = llvm::cast<llvm::MDNode>(arguments->getOperand(0));
		return emit_execution_modes_thread_wave_properties(num_threads);
	}
	else
		return false;
}